

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

bool __thiscall jbcoin::STObject::isEquivalent(STObject *this,STBase *t)

{
  STObject *local_40;
  STObject *v;
  STBase *t_local;
  STObject *this_local;
  
  if (t == (STBase *)0x0) {
    local_40 = (STObject *)0x0;
  }
  else {
    local_40 = (STObject *)__dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  }
  if (local_40 == (STObject *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((this->mType == (SOTemplate *)0x0) || (local_40->mType != this->mType)) {
    this_local._7_1_ = equivalentSTObject(this,local_40);
  }
  else {
    this_local._7_1_ = equivalentSTObjectSameTemplate(this,local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool STObject::isEquivalent (const STBase& t) const
{
    const STObject* v = dynamic_cast<const STObject*> (&t);

    if (!v)
        return false;

    if (mType != nullptr && (v->mType == mType))
        return equivalentSTObjectSameTemplate (*this, *v);

    return equivalentSTObject (*this, *v);
}